

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

MultiIndexSet * __thiscall
TasGrid::GridWavelet::getRefinementCanidates
          (MultiIndexSet *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  bool local_161;
  MultiIndexSet local_160;
  int local_138;
  int local_134;
  int j_2;
  int r;
  int *p_2;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> parent;
  int i_2;
  int num_needed;
  Data2D<int> addons;
  size_t num_added;
  int j_1;
  int *p_1;
  int i_1;
  int j;
  int *p;
  int i;
  int num_points;
  undefined1 local_88 [8];
  Data2D<int> refined;
  undefined1 local_58 [7];
  bool useParents;
  Data2D<int> pmap;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  GridWavelet *this_local;
  MultiIndexSet *result;
  
  pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)level_limits;
  buildUpdateMap((Data2D<int> *)local_58,this,tolerance,criteria,output);
  local_161 = criteria == refine_fds || criteria == refine_parents_first;
  refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = local_161;
  Data2D<int>::Data2D<int,int>
            ((Data2D<int> *)local_88,(this->super_BaseCanonicalGrid).num_dimensions,0);
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    for (p._4_4_ = 0; p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
      piVar4 = Data2D<int>::getStrip((Data2D<int> *)local_58,p._4_4_);
      for (p_1._4_4_ = 0; p_1._4_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
          p_1._4_4_ = p_1._4_4_ + 1) {
        if (piVar4[p_1._4_4_] == 1) {
          if ((refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            piVar5 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,p._4_4_);
            bVar1 = addParent(this,piVar5,p_1._4_4_,(Data2D<int> *)local_88);
            if (bVar1) goto LAB_002484e6;
          }
          piVar5 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,p._4_4_);
          addChild(this,piVar5,p_1._4_4_,(Data2D<int> *)local_88);
        }
LAB_002484e6:
      }
    }
  }
  else {
    for (p_1._0_4_ = 0; (int)p_1 < iVar2; p_1._0_4_ = (int)p_1 + 1) {
      piVar4 = Data2D<int>::getStrip((Data2D<int> *)local_58,(int)p_1);
      for (num_added._4_4_ = 0; num_added._4_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
          num_added._4_4_ = num_added._4_4_ + 1) {
        if (piVar4[num_added._4_4_] == 1) {
          if ((refined.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            piVar5 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,(int)p_1);
            bVar1 = addParent(this,piVar5,num_added._4_4_,(Data2D<int> *)local_88);
            if (bVar1) goto LAB_0024862d;
          }
          piVar5 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,(int)p_1);
          addChildLimited(this,piVar5,num_added._4_4_,
                          (vector<int,_std::allocator<int>_> *)
                          pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(Data2D<int> *)local_88);
        }
LAB_0024862d:
      }
    }
  }
  iVar2 = Data2D<int>::getNumStrips((Data2D<int> *)local_88);
  if (iVar2 < 1) {
    MultiIndexSet::MultiIndexSet(__return_storage_ptr__);
  }
  else {
    MultiIndexSet::MultiIndexSet(__return_storage_ptr__,(Data2D<int> *)local_88);
  }
  if (criteria == refine_stable) {
    addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    while (addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage != (pointer)0x0) {
      Data2D<int>::Data2D<int,int>
                ((Data2D<int> *)&i_2,(this->super_BaseCanonicalGrid).num_dimensions,0);
      parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(__return_storage_ptr__);
      for (parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_ = 0;
          (int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage <
          parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
          parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        MultiIndexSet::copyIndex
                  ((vector<int,_std::allocator<int>_> *)&__range4,__return_storage_ptr__,
                   (int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        __end4 = ::std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&__range4);
        p_2 = (int *)::std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)&__range4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&p_2), bVar1) {
          _j_2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end4);
          local_134 = *_j_2;
          iVar2 = RuleWavelet::getParent(&this->rule1D,local_134);
          *_j_2 = iVar2;
          if (((-1 < *_j_2) &&
              (bVar1 = MultiIndexSet::missing
                                 (__return_storage_ptr__,
                                  (vector<int,_std::allocator<int>_> *)&__range4), bVar1)) &&
             (bVar1 = MultiIndexSet::missing
                                (&(this->super_BaseCanonicalGrid).points,
                                 (vector<int,_std::allocator<int>_> *)&__range4), bVar1)) {
            Data2D<int>::appendStrip
                      ((Data2D<int> *)&i_2,(vector<int,_std::allocator<int>_> *)&__range4);
          }
          if (*_j_2 == -2) {
            for (local_138 = 0; iVar2 = local_138,
                iVar3 = RuleWavelet::getNumPoints(&this->rule1D,0), iVar2 < iVar3;
                local_138 = local_138 + 1) {
              *_j_2 = local_138;
              bVar1 = MultiIndexSet::missing
                                (__return_storage_ptr__,
                                 (vector<int,_std::allocator<int>_> *)&__range4);
              if ((bVar1) &&
                 (bVar1 = MultiIndexSet::missing
                                    (&(this->super_BaseCanonicalGrid).points,
                                     (vector<int,_std::allocator<int>_> *)&__range4), bVar1)) {
                Data2D<int>::appendStrip
                          ((Data2D<int> *)&i_2,(vector<int,_std::allocator<int>_> *)&__range4);
              }
            }
          }
          *_j_2 = local_134;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        ::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)&__range4);
      }
      iVar2 = Data2D<int>::getNumStrips((Data2D<int> *)&i_2);
      addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(long)iVar2;
      if (addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        MultiIndexSet::MultiIndexSet(&local_160,(Data2D<int> *)&i_2);
        MultiIndexSet::operator+=(__return_storage_ptr__,&local_160);
        MultiIndexSet::~MultiIndexSet(&local_160);
      }
      Data2D<int>::~Data2D((Data2D<int> *)&i_2);
    }
  }
  Data2D<int>::~Data2D((Data2D<int> *)local_88);
  Data2D<int>::~Data2D((Data2D<int> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridWavelet::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits) const{
    Data2D<int> pmap = buildUpdateMap(tolerance, criteria, output);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChild(points.getIndex(i), j, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChildLimited(points.getIndex(i), j, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChild(points.getIndex(i), j, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChildLimited(points.getIndex(i), j, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result = (refined.getNumStrips() > 0) ? MultiIndexSet(refined) : MultiIndexSet();

    if (criteria == refine_stable){ // complete needed to a lower set
        size_t num_added = 1; // set to 1 to start the loop
        while(num_added > 0){
            Data2D<int> addons(num_dimensions, 0);
            int num_needed = result.getNumIndexes();

            for(int i=0; i<num_needed; i++){
                std::vector<int> parent = result.copyIndex(i);
                for(auto &p : parent){
                    int r = p;
                    p = rule1D.getParent(r);
                    if ((p > -1) && result.missing(parent) && points.missing(parent))
                        addons.appendStrip(parent);
                    if (p == -2){ // all parents on level 0
                        for(int j=0; j<rule1D.getNumPoints(0); j++){
                            p = j;
                            if (result.missing(parent) && points.missing(parent))
                                addons.appendStrip(parent);
                        }
                    }
                    p = r;
                }
            }

            num_added = addons.getNumStrips();
            if (num_added > 0)
                result += addons;
        }
    }

    return result;
}